

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O0

void __thiscall
duckdb::GeoParquetFileMetadata::Write(GeoParquetFileMetadata *this,FileMetaData *file_meta_data)

{
  yyjson_mut_val *pyVar1;
  yyjson_mut_doc *pyVar2;
  byte bVar3;
  void *pvVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  InvalidInputException *this_00;
  undefined8 uVar8;
  long in_RSI;
  long in_RDI;
  bool bVar9;
  bool bVar10;
  KeyValue kv;
  char *json;
  size_t len;
  yyjson_write_err err;
  yyjson_mut_val *crs_key;
  yyjson_mut_val *crs_val;
  yyjson_val *crs_root;
  yyjson_doc *crs_doc;
  yyjson_mut_val *bbox;
  char *type_name;
  WKBGeometryType *geometry_type;
  iterator __end2;
  iterator __begin2;
  set<duckdb::WKBGeometryType,_std::less<duckdb::WKBGeometryType>,_std::allocator<duckdb::WKBGeometryType>_>
  *__range2;
  yyjson_mut_val *geometry_types;
  yyjson_mut_val *column_json;
  value_type *column;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>_>
  *__range1;
  yyjson_mut_val *json_columns;
  yyjson_mut_val *root;
  yyjson_mut_doc *doc;
  yyjson_alc alc_21;
  yyjson_mut_val *val;
  bool noesc_1;
  size_t key_len_1;
  yyjson_mut_val *val_5;
  size_t len_2;
  yyjson_mut_val *key_1;
  bool noesc;
  size_t key_len;
  yyjson_mut_val *val_3;
  size_t len_1;
  yyjson_mut_val *key;
  yyjson_mut_val *val_11;
  yyjson_mut_val *key_3;
  yyjson_mut_val *val_14;
  yyjson_mut_val *val_6;
  yyjson_mut_val *key_2;
  yyjson_mut_val *val_9;
  bool val_noesc;
  size_t val_len;
  bool noesc_4;
  size_t key_len_2;
  yyjson_mut_val *val_17;
  size_t len_5;
  yyjson_mut_val *key_4;
  yyjson_mut_val *val_26;
  yyjson_mut_val *key_6;
  yyjson_mut_val *val_18;
  yyjson_mut_val *key_5;
  yyjson_mut_val *val_23;
  yyjson_mut_val *val_40;
  yyjson_mut_val *val_37;
  yyjson_mut_val *val_34;
  yyjson_mut_val *val_31;
  char *new_str;
  yyjson_mut_val *val_43;
  yyjson_subtype sub_5;
  bool noesc_8;
  size_t len_14;
  yyjson_val_pool *pool_19;
  yyjson_alc *alc_19;
  yyjson_mut_val *val_44;
  yyjson_val_pool *pool_9;
  yyjson_alc *alc_9;
  yyjson_mut_val *val_16;
  yyjson_val_pool *pool_6;
  yyjson_alc *alc_6;
  yyjson_mut_val *val_10;
  yyjson_val_pool *pool_8;
  yyjson_alc *alc_8;
  yyjson_mut_val *val_15;
  yyjson_val_pool *pool_1;
  yyjson_alc *alc_1;
  yyjson_mut_val *val_2;
  yyjson_val_pool *pool_3;
  yyjson_alc *alc_3;
  yyjson_mut_val *val_4;
  yyjson_val_pool *pool;
  yyjson_alc *alc;
  yyjson_mut_val *val_1;
  uint8_t tag_33;
  uint8_t tag_7;
  uint8_t tag_4;
  uint8_t tag_18;
  uint8_t tag_12;
  uint8_t tag_10;
  uint8_t tag;
  uint8_t tag_2;
  char *mem_4;
  char *mem;
  char *mem_2;
  yyjson_mut_val *next_key_7;
  yyjson_mut_val *prev_val_7;
  yyjson_mut_val *next_key_3;
  yyjson_mut_val *prev_val_3;
  yyjson_mut_val *next_key_2;
  yyjson_mut_val *prev_val_2;
  yyjson_mut_val *next_key_6;
  yyjson_mut_val *prev_val_6;
  yyjson_mut_val *next_key_5;
  yyjson_mut_val *prev_val_5;
  yyjson_mut_val *next_key_4;
  yyjson_mut_val *prev_val_4;
  yyjson_mut_val *next_key;
  yyjson_mut_val *prev_val;
  yyjson_mut_val *next_key_1;
  yyjson_mut_val *prev_val_1;
  yyjson_str_pool *pool_4;
  yyjson_alc *alc_4;
  char *mem_3;
  yyjson_str_pool *pool_2;
  yyjson_alc *alc_2;
  char *mem_1;
  yyjson_str_pool *pool_20;
  yyjson_alc *alc_20;
  char *mem_5;
  uint64_t tag_3;
  uint64_t tag_1;
  uint64_t tag_11;
  uint64_t tag_14;
  uint64_t tag_20;
  uint64_t tag_6;
  uint64_t tag_9;
  uint64_t tag_35;
  yyjson_mut_val *val_24;
  yyjson_subtype sub_3;
  bool noesc_6;
  size_t len_7;
  yyjson_val_pool *pool_12;
  yyjson_alc *alc_12;
  yyjson_mut_val *val_25;
  yyjson_mut_val *val_19;
  yyjson_subtype sub_2;
  bool noesc_5;
  size_t len_6;
  yyjson_val_pool *pool_10;
  yyjson_alc *alc_10;
  yyjson_mut_val *val_20;
  yyjson_mut_val *val_27;
  yyjson_subtype sub_4;
  bool noesc_7;
  size_t len_9;
  yyjson_val_pool *pool_13;
  yyjson_alc *alc_13;
  yyjson_mut_val *val_28;
  yyjson_mut_val *val_7;
  yyjson_subtype sub;
  bool noesc_2;
  size_t len_3;
  yyjson_val_pool *pool_5;
  yyjson_alc *alc_5;
  yyjson_mut_val *val_8;
  yyjson_mut_val *val_12;
  yyjson_subtype sub_1;
  bool noesc_3;
  size_t len_4;
  yyjson_val_pool *pool_7;
  yyjson_alc *alc_7;
  yyjson_mut_val *val_13;
  yyjson_mut_val *val_21;
  yyjson_val_pool *pool_11;
  yyjson_alc *alc_11;
  yyjson_mut_val *val_22;
  yyjson_mut_val *val_29;
  yyjson_val_pool *pool_14;
  yyjson_alc *alc_14;
  yyjson_mut_val *val_30;
  uint8_t tag_21;
  uint8_t tag_24;
  uint8_t tag_27;
  uint8_t tag_30;
  uint8_t tag_15;
  yyjson_mut_val *next_1;
  yyjson_mut_val *prev_1;
  size_t len_10;
  uint64_t tag_23;
  uint8_t tag_22;
  yyjson_mut_val *next_2;
  yyjson_mut_val *prev_2;
  size_t len_11;
  uint64_t tag_26;
  uint8_t tag_25;
  yyjson_mut_val *next_3;
  yyjson_mut_val *prev_3;
  size_t len_12;
  uint64_t tag_29;
  uint8_t tag_28;
  yyjson_mut_val *next_4;
  yyjson_mut_val *prev_4;
  size_t len_13;
  uint64_t tag_32;
  uint8_t tag_31;
  yyjson_mut_val *next;
  yyjson_mut_val *prev;
  size_t len_8;
  uint64_t tag_17;
  uint8_t tag_16;
  yyjson_mut_val *val_32;
  yyjson_val_pool *pool_15;
  yyjson_alc *alc_15;
  yyjson_mut_val *val_33;
  yyjson_mut_val *val_35;
  yyjson_val_pool *pool_16;
  yyjson_alc *alc_16;
  yyjson_mut_val *val_36;
  yyjson_mut_val *val_38;
  yyjson_val_pool *pool_17;
  yyjson_alc *alc_17;
  yyjson_mut_val *val_39;
  yyjson_mut_val *val_41;
  yyjson_val_pool *pool_18;
  yyjson_alc *alc_18;
  yyjson_mut_val *val_42;
  uint8_t tag_34;
  uint8_t tag_8;
  uint8_t tag_5;
  uint8_t tag_19;
  uint8_t tag_13;
  string *in_stack_ffffffffffffea08;
  KeyValue *in_stack_ffffffffffffea10;
  KeyValue *this_01;
  allocator *this_02;
  undefined1 in_stack_ffffffffffffea40;
  undefined1 in_stack_ffffffffffffea41;
  undefined1 in_stack_ffffffffffffea42;
  undefined1 in_stack_ffffffffffffea43;
  undefined1 in_stack_ffffffffffffea44;
  undefined1 in_stack_ffffffffffffea45;
  byte in_stack_ffffffffffffea46;
  undefined1 in_stack_ffffffffffffea47;
  yyjson_val *in_stack_ffffffffffffea48;
  SerializationException *in_stack_ffffffffffffea50;
  bool local_1598;
  bool local_1594;
  bool local_1590;
  bool local_158c;
  yyjson_mut_val *local_1588;
  bool local_1577;
  bool local_1573;
  yyjson_mut_val *local_1570;
  byte local_155d;
  yyjson_mut_val *local_1558;
  bool local_1531;
  yyjson_mut_val *local_1530;
  allocator local_14d1;
  string local_14d0 [39];
  allocator local_14a9;
  string local_14a8 [118];
  undefined1 local_1432;
  allocator local_1431;
  string local_1430 [32];
  KeyValue *local_1410;
  value_type *local_1408;
  yyjson_write_err local_1400;
  yyjson_mut_val *local_13f0;
  yyjson_mut_val *local_13e8;
  yyjson_val *local_13e0;
  undefined1 local_13d5;
  allocator local_13c1;
  string local_13c0 [32];
  undefined8 *local_13a0;
  yyjson_mut_val *local_1398;
  char *local_1390;
  reference local_1388;
  _Self local_1380;
  _Self local_1378;
  set<duckdb::WKBGeometryType,_std::less<duckdb::WKBGeometryType>,_std::allocator<duckdb::WKBGeometryType>_>
  *local_1370;
  yyjson_mut_val *local_1368;
  yyjson_mut_val *local_1360;
  reference local_1358;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_true>
  local_1350;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_true>
  local_1348;
  long local_1340;
  yyjson_mut_val *local_1338;
  yyjson_mut_val *local_1330;
  yyjson_mut_doc *local_1328;
  long local_1320;
  undefined4 local_130c;
  ulong local_1308;
  char *local_1300;
  undefined8 *local_12f8;
  undefined8 local_12f0;
  undefined8 local_12e8;
  code *local_12e0;
  undefined8 local_12d8;
  undefined8 *local_12d0;
  yyjson_mut_val *local_12c8;
  yyjson_mut_doc *local_12c0;
  yyjson_mut_val *local_12b8;
  yyjson_mut_val *local_12b0;
  yyjson_mut_doc *local_12a8;
  undefined1 local_1299;
  size_t local_1298;
  yyjson_mut_val *local_1290;
  ulong local_1288;
  yyjson_mut_val *local_1280;
  ulong local_1278;
  void *local_1270;
  char *local_1268;
  yyjson_mut_val *local_1260;
  yyjson_mut_doc *local_1258;
  undefined1 local_124a;
  undefined1 local_1249;
  size_t local_1248;
  yyjson_mut_val *local_1240;
  ulong local_1238;
  yyjson_mut_val *local_1230;
  ulong local_1228;
  void *local_1220;
  char *local_1218;
  yyjson_mut_val *local_1210;
  yyjson_mut_doc *local_1208;
  undefined1 local_11f9;
  yyjson_mut_val *local_11f8;
  yyjson_mut_val *local_11f0;
  char *local_11e8;
  yyjson_mut_val *local_11e0;
  yyjson_mut_doc *local_11d8;
  yyjson_mut_val *local_11d0;
  yyjson_mut_doc *local_11c8;
  yyjson_mut_val *local_11c0;
  yyjson_mut_val *local_11b8;
  yyjson_mut_val *local_11b0;
  char *local_11a8;
  yyjson_mut_val *local_11a0;
  yyjson_mut_doc *local_1198;
  yyjson_mut_val *local_1190;
  yyjson_mut_doc *local_1188;
  yyjson_mut_val *local_1180;
  byte local_1171;
  size_t local_1170;
  undefined1 local_1161;
  size_t local_1160;
  yyjson_mut_val *local_1158;
  ulong local_1150;
  yyjson_mut_val *local_1148;
  char *local_1140;
  char *local_1138;
  yyjson_mut_val *local_1130;
  yyjson_mut_doc *local_1128;
  undefined1 local_1119;
  yyjson_mut_val *local_1118;
  yyjson_mut_val *local_1110;
  char *local_1108;
  yyjson_mut_val *local_1100;
  yyjson_mut_doc *local_10f8;
  yyjson_mut_val *local_10f0;
  yyjson_mut_val *local_10e8;
  char *local_10e0;
  yyjson_mut_val *local_10d8;
  yyjson_mut_doc *local_10d0;
  yyjson_mut_val *local_10c8;
  char *local_10c0;
  yyjson_mut_val *local_10b8;
  yyjson_mut_doc *local_10b0;
  undefined1 local_10a1;
  yyjson_mut_val *local_10a0;
  yyjson_val_uni local_1098;
  yyjson_mut_val *local_1090;
  yyjson_mut_doc *local_1088;
  undefined1 local_1079;
  yyjson_mut_val *local_1078;
  yyjson_val_uni local_1070;
  yyjson_mut_val *local_1068;
  yyjson_mut_doc *local_1060;
  undefined1 local_1051;
  yyjson_mut_val *local_1050;
  yyjson_val_uni local_1048;
  yyjson_mut_val *local_1040;
  yyjson_mut_doc *local_1038;
  undefined1 local_1029;
  yyjson_mut_val *local_1028;
  yyjson_val_uni local_1020;
  yyjson_mut_val *local_1018;
  yyjson_mut_doc *local_1010;
  undefined1 local_1001;
  char *local_1000;
  yyjson_mut_val *local_ff8;
  byte local_fea;
  undefined1 local_fe9;
  size_t local_fe8;
  char *local_fe0;
  yyjson_mut_doc *local_fd8;
  yyjson_mut_val *local_fd0;
  yyjson_mut_val *local_fc8;
  yyjson_mut_val *local_fc0;
  yyjson_mut_val *local_fb8;
  char local_fa9;
  yyjson_mut_val *local_fa8;
  yyjson_mut_val *local_fa0;
  yyjson_mut_val *local_f98;
  char local_f89;
  yyjson_mut_val *local_f88;
  yyjson_mut_val *local_f80;
  yyjson_mut_val *local_f78;
  char local_f69;
  yyjson_mut_val *local_f68;
  yyjson_mut_val *local_f60;
  yyjson_mut_val *local_f58;
  char local_f49;
  yyjson_mut_val *local_f48;
  yyjson_mut_val *local_f40;
  yyjson_mut_val *local_f38;
  undefined1 local_f29;
  yyjson_mut_val *local_f28;
  yyjson_mut_val *local_f20;
  yyjson_mut_val *local_f18;
  yyjson_mut_val *local_f10;
  yyjson_mut_val *local_f08;
  yyjson_mut_val *local_f00;
  yyjson_mut_val *local_ef8;
  yyjson_mut_val *local_ef0;
  yyjson_val_pool *local_ee8;
  yyjson_alc *local_ee0;
  yyjson_mut_val *local_ed8;
  long local_ed0;
  yyjson_mut_doc *local_ec8;
  yyjson_mut_val *local_ec0;
  yyjson_val_pool *local_eb8;
  yyjson_alc *local_eb0;
  yyjson_mut_val *local_ea8;
  long local_ea0;
  yyjson_mut_doc *local_e98;
  yyjson_mut_val *local_e90;
  yyjson_val_pool *local_e88;
  yyjson_alc *local_e80;
  yyjson_mut_val *local_e78;
  long local_e70;
  yyjson_mut_doc *local_e68;
  yyjson_mut_val *local_e60;
  yyjson_val_pool *local_e58;
  yyjson_alc *local_e50;
  yyjson_mut_val *local_e48;
  long local_e40;
  yyjson_mut_doc *local_e38;
  yyjson_mut_val *local_e30;
  yyjson_val_pool *local_e28;
  yyjson_alc *local_e20;
  yyjson_mut_val *local_e18;
  long local_e10;
  yyjson_mut_doc *local_e08;
  yyjson_mut_val *local_e00;
  yyjson_val_pool *local_df8;
  yyjson_alc *local_df0;
  yyjson_mut_val *local_de8;
  long local_de0;
  yyjson_mut_doc *local_dd8;
  yyjson_mut_val *local_dd0;
  yyjson_val_pool *local_dc8;
  yyjson_alc *local_dc0;
  yyjson_mut_val *local_db8;
  long local_db0;
  yyjson_mut_doc *local_da8;
  yyjson_mut_val *local_da0;
  yyjson_mut_val *local_d98;
  yyjson_mut_val *local_d90;
  byte local_d81;
  yyjson_mut_val *local_d80;
  yyjson_mut_val *local_d78;
  yyjson_mut_val *local_d70;
  byte local_d61;
  yyjson_mut_val *local_d60;
  yyjson_mut_val *local_d58;
  yyjson_mut_val *local_d50;
  byte local_d41;
  yyjson_mut_val *local_d40;
  yyjson_mut_val *local_d38;
  yyjson_mut_val *local_d30;
  byte local_d21;
  yyjson_mut_val *local_d20;
  yyjson_mut_val *local_d18;
  yyjson_mut_val *local_d10;
  byte local_d01;
  yyjson_mut_val *local_d00;
  yyjson_mut_val *local_cf8;
  yyjson_mut_val *local_cf0;
  byte local_ce1;
  yyjson_mut_val *local_ce0;
  yyjson_mut_val *local_cd8;
  yyjson_mut_val *local_cd0;
  byte local_cc1;
  yyjson_mut_val *local_cc0;
  yyjson_mut_val *local_cb8;
  yyjson_mut_val *local_cb0;
  byte local_ca1;
  yyjson_mut_val *local_ca0;
  size_t local_c78;
  char *local_c70;
  undefined1 local_c61;
  size_t local_c40;
  char *local_c38;
  undefined1 local_c29;
  size_t local_c08;
  char *local_c00;
  undefined1 local_bf1;
  size_t local_bd0;
  char *local_bc8;
  undefined1 local_bb9;
  size_t local_b98;
  char *local_b90;
  undefined1 local_b81;
  char *local_b80;
  ulong local_b78;
  char *local_b70;
  yyjson_mut_doc *local_b68;
  char *local_b60;
  char *local_b58;
  ulong local_b50;
  void *local_b48;
  yyjson_mut_doc *local_b40;
  char *local_b38;
  char *local_b30;
  ulong local_b28;
  void *local_b20;
  yyjson_mut_doc *local_b18;
  char *local_b10;
  yyjson_mut_val *local_b08;
  long local_b00;
  ulong local_af8;
  yyjson_mut_val *local_af0;
  yyjson_mut_val *local_ae8;
  yyjson_mut_val *local_ae0;
  yyjson_mut_val *local_ad8;
  long local_ad0;
  ulong local_ac8;
  yyjson_mut_val *local_ac0;
  yyjson_mut_val *local_ab8;
  yyjson_mut_val *local_ab0;
  yyjson_mut_val *local_aa8;
  long local_aa0;
  ulong local_a98;
  yyjson_mut_val *local_a90;
  yyjson_mut_val *local_a88;
  yyjson_mut_val *local_a80;
  yyjson_mut_val *local_a78;
  long local_a70;
  ulong local_a68;
  yyjson_mut_val *local_a60;
  yyjson_mut_val *local_a58;
  yyjson_mut_val *local_a50;
  yyjson_mut_val *local_a48;
  long local_a40;
  ulong local_a38;
  yyjson_mut_val *local_a30;
  yyjson_mut_val *local_a28;
  yyjson_mut_val *local_a20;
  yyjson_mut_val *local_a18;
  long local_a10;
  ulong local_a08;
  yyjson_mut_val *local_a00;
  yyjson_mut_val *local_9f8;
  yyjson_mut_val *local_9f0;
  yyjson_mut_val *local_9e8;
  long local_9e0;
  ulong local_9d8;
  yyjson_mut_val *local_9d0;
  yyjson_mut_val *local_9c8;
  yyjson_mut_val *local_9c0;
  yyjson_mut_val *local_9b8;
  long local_9b0;
  ulong local_9a8;
  yyjson_mut_val *local_9a0;
  yyjson_mut_val *local_998;
  yyjson_mut_val *local_990;
  yyjson_str_pool *local_988;
  yyjson_alc *local_980;
  char *local_978;
  ulong local_970;
  yyjson_mut_doc *local_968;
  char *local_960;
  yyjson_str_pool *local_958;
  yyjson_alc *local_950;
  char *local_948;
  ulong local_940;
  yyjson_mut_doc *local_938;
  char *local_930;
  yyjson_str_pool *local_928;
  yyjson_alc *local_920;
  char *local_918;
  ulong local_910;
  yyjson_mut_doc *local_908;
  char *local_900;
  ulong local_8f8;
  long local_8f0;
  yyjson_mut_val *local_8e8;
  ulong local_8e0;
  long local_8d8;
  yyjson_mut_val *local_8d0;
  ulong local_8c8;
  long local_8c0;
  yyjson_mut_val *local_8b8;
  ulong local_8b0;
  long local_8a8;
  yyjson_mut_val *local_8a0;
  ulong local_898;
  long local_890;
  yyjson_mut_val *local_888;
  ulong local_880;
  long local_878;
  yyjson_mut_val *local_870;
  ulong local_868;
  long local_860;
  yyjson_mut_val *local_858;
  ulong local_850;
  long local_848;
  yyjson_mut_val *local_840;
  yyjson_mut_val *local_838;
  byte local_82a;
  undefined1 local_829;
  size_t local_828;
  char *local_820;
  yyjson_mut_doc *local_818;
  yyjson_mut_val *local_810;
  yyjson_val_pool *local_808;
  yyjson_alc *local_800;
  yyjson_mut_val *local_7f8;
  long local_7f0;
  yyjson_mut_doc *local_7e8;
  yyjson_mut_val *local_7e0;
  size_t local_7b8;
  char *local_7b0;
  undefined1 local_7a1;
  yyjson_mut_val *local_7a0;
  byte local_792;
  undefined1 local_791;
  size_t local_790;
  char *local_788;
  yyjson_mut_doc *local_780;
  yyjson_mut_val *local_778;
  yyjson_val_pool *local_770;
  yyjson_alc *local_768;
  yyjson_mut_val *local_760;
  long local_758;
  yyjson_mut_doc *local_750;
  yyjson_mut_val *local_748;
  size_t local_720;
  char *local_718;
  undefined1 local_709;
  yyjson_mut_val *local_708;
  byte local_6fa;
  undefined1 local_6f9;
  size_t local_6f8;
  char *local_6f0;
  yyjson_mut_doc *local_6e8;
  yyjson_mut_val *local_6e0;
  yyjson_val_pool *local_6d8;
  yyjson_alc *local_6d0;
  yyjson_mut_val *local_6c8;
  long local_6c0;
  yyjson_mut_doc *local_6b8;
  yyjson_mut_val *local_6b0;
  size_t local_688;
  char *local_680;
  undefined1 local_671;
  yyjson_mut_val *local_670;
  byte local_662;
  undefined1 local_661;
  size_t local_660;
  char *local_658;
  yyjson_mut_doc *local_650;
  yyjson_mut_val *local_648;
  yyjson_val_pool *local_640;
  yyjson_alc *local_638;
  yyjson_mut_val *local_630;
  long local_628;
  yyjson_mut_doc *local_620;
  yyjson_mut_val *local_618;
  size_t local_5f0;
  char *local_5e8;
  undefined1 local_5d9;
  yyjson_mut_val *local_5d8;
  byte local_5ca;
  undefined1 local_5c9;
  size_t local_5c8;
  char *local_5c0;
  yyjson_mut_doc *local_5b8;
  yyjson_mut_val *local_5b0;
  yyjson_val_pool *local_5a8;
  yyjson_alc *local_5a0;
  yyjson_mut_val *local_598;
  long local_590;
  yyjson_mut_doc *local_588;
  yyjson_mut_val *local_580;
  size_t local_558;
  char *local_550;
  undefined1 local_541;
  yyjson_mut_val *local_540;
  yyjson_mut_doc *local_538;
  yyjson_mut_val *local_530;
  yyjson_val_pool *local_528;
  yyjson_alc *local_520;
  yyjson_mut_val *local_518;
  long local_510;
  yyjson_mut_doc *local_508;
  yyjson_mut_val *local_500;
  yyjson_mut_val *local_4f8;
  yyjson_mut_doc *local_4f0;
  yyjson_mut_val *local_4e8;
  yyjson_val_pool *local_4e0;
  yyjson_alc *local_4d8;
  yyjson_mut_val *local_4d0;
  long local_4c8;
  yyjson_mut_doc *local_4c0;
  yyjson_mut_val *local_4b8;
  yyjson_mut_val *local_4b0;
  yyjson_mut_val *local_4a8;
  byte local_499;
  yyjson_mut_val *local_498;
  yyjson_mut_val *local_490;
  yyjson_mut_val *local_488;
  byte local_479;
  yyjson_mut_val *local_478;
  yyjson_mut_val *local_470;
  yyjson_mut_val *local_468;
  byte local_459;
  yyjson_mut_val *local_458;
  yyjson_mut_val *local_450;
  yyjson_mut_val *local_448;
  byte local_439;
  yyjson_mut_val *local_438;
  yyjson_mut_val *local_430;
  yyjson_mut_val *local_428;
  byte local_419;
  yyjson_mut_val *local_418;
  yyjson_mut_val *local_410;
  uint64_t local_408;
  ulong local_400;
  yyjson_mut_val *local_3f8;
  yyjson_mut_val *local_3f0;
  undefined1 local_3e1;
  yyjson_mut_val *local_3e0;
  ulong local_3d8;
  long local_3d0;
  yyjson_mut_val *local_3c8;
  yyjson_mut_val *local_3c0;
  yyjson_mut_val *local_3b8;
  byte local_3a9;
  yyjson_mut_val *local_3a8;
  yyjson_mut_val *local_3a0;
  uint64_t local_398;
  ulong local_390;
  yyjson_mut_val *local_388;
  yyjson_mut_val *local_380;
  undefined1 local_371;
  yyjson_mut_val *local_370;
  ulong local_368;
  long local_360;
  yyjson_mut_val *local_358;
  yyjson_mut_val *local_350;
  yyjson_mut_val *local_348;
  byte local_339;
  yyjson_mut_val *local_338;
  yyjson_mut_val *local_330;
  uint64_t local_328;
  ulong local_320;
  yyjson_mut_val *local_318;
  yyjson_mut_val *local_310;
  undefined1 local_301;
  yyjson_mut_val *local_300;
  ulong local_2f8;
  long local_2f0;
  yyjson_mut_val *local_2e8;
  yyjson_mut_val *local_2e0;
  yyjson_mut_val *local_2d8;
  byte local_2c9;
  yyjson_mut_val *local_2c8;
  yyjson_mut_val *local_2c0;
  uint64_t local_2b8;
  ulong local_2b0;
  yyjson_mut_val *local_2a8;
  yyjson_mut_val *local_2a0;
  undefined1 local_291;
  yyjson_mut_val *local_290;
  ulong local_288;
  long local_280;
  yyjson_mut_val *local_278;
  yyjson_mut_val *local_270;
  yyjson_mut_val *local_268;
  byte local_259;
  yyjson_mut_val *local_258;
  yyjson_mut_val *local_250;
  uint64_t local_248;
  ulong local_240;
  yyjson_mut_val *local_238;
  yyjson_mut_val *local_230;
  undefined1 local_221;
  yyjson_mut_val *local_220;
  ulong local_218;
  long local_210;
  yyjson_mut_val *local_208;
  yyjson_mut_val *local_200;
  yyjson_mut_val *local_1f8;
  byte local_1e9;
  yyjson_mut_val *local_1e8;
  yyjson_mut_val *local_1e0;
  yyjson_val_uni local_1d8;
  yyjson_mut_doc *local_1d0;
  yyjson_mut_val *local_1c8;
  yyjson_val_pool *local_1c0;
  yyjson_alc *local_1b8;
  yyjson_mut_val *local_1b0;
  long local_1a8;
  yyjson_mut_doc *local_1a0;
  yyjson_mut_val *local_198;
  yyjson_mut_val *local_190;
  yyjson_val_uni local_188;
  yyjson_mut_doc *local_180;
  yyjson_mut_val *local_178;
  yyjson_val_pool *local_170;
  yyjson_alc *local_168;
  yyjson_mut_val *local_160;
  long local_158;
  yyjson_mut_doc *local_150;
  yyjson_mut_val *local_148;
  yyjson_mut_val *local_140;
  yyjson_val_uni local_138;
  yyjson_mut_doc *local_130;
  yyjson_mut_val *local_128;
  yyjson_val_pool *local_120;
  yyjson_alc *local_118;
  yyjson_mut_val *local_110;
  long local_108;
  yyjson_mut_doc *local_100;
  yyjson_mut_val *local_f8;
  yyjson_mut_val *local_f0;
  yyjson_val_uni local_e8;
  yyjson_mut_doc *local_e0;
  yyjson_mut_val *local_d8;
  yyjson_val_pool *local_d0;
  yyjson_alc *local_c8;
  yyjson_mut_val *local_c0;
  long local_b8;
  yyjson_mut_doc *local_b0;
  yyjson_mut_val *local_a8;
  yyjson_mut_val *local_a0;
  yyjson_mut_val *local_98;
  byte local_89;
  yyjson_mut_val *local_88;
  yyjson_mut_val *local_80;
  yyjson_mut_val *local_78;
  byte local_69;
  yyjson_mut_val *local_68;
  yyjson_mut_val *local_60;
  yyjson_mut_val *local_58;
  byte local_49;
  yyjson_mut_val *local_48;
  yyjson_mut_val *local_40;
  yyjson_mut_val *local_38;
  byte local_29;
  yyjson_mut_val *local_28;
  yyjson_mut_val *local_20;
  yyjson_mut_val *local_18;
  byte local_9;
  yyjson_mut_val *local_8;
  
  local_1320 = in_RSI;
  local_1328 = (yyjson_mut_doc *)duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  local_12c0 = local_1328;
  if (local_1328 == (yyjson_mut_doc *)0x0) {
LAB_006e5e8d:
    local_12b8 = (yyjson_mut_val *)0x0;
  }
  else {
    local_db0 = 1;
    local_dc0 = &local_1328->alc;
    local_dc8 = &local_1328->val_pool;
    local_da8 = local_1328;
    if ((((long)(local_1328->val_pool).end - (long)local_dc8->cur) / 0x18 == 0) &&
       (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_dc8,local_dc0,1),
       ((bVar3 ^ 0xff) & 1) != 0)) {
      local_da0 = (yyjson_mut_val *)0x0;
    }
    else {
      local_db8 = local_dc8->cur;
      local_dc8->cur = local_dc8->cur + local_db0;
      local_da0 = local_db8;
    }
    local_12c8 = local_da0;
    if (local_da0 == (yyjson_mut_val *)0x0) goto LAB_006e5e8d;
    local_da0->tag = 7;
    local_12b8 = local_da0;
  }
  pyVar1 = local_12b8;
  pyVar2 = local_1328;
  local_1330 = local_12b8;
  local_12a8 = local_1328;
  local_12b0 = local_12b8;
  if (local_1328 != (yyjson_mut_doc *)0x0) {
    local_1328->root = local_12b8;
  }
  pvVar4 = (void *)std::__cxx11::string::c_str();
  local_1228 = std::__cxx11::string::size();
  local_1208 = pyVar2;
  local_1210 = pyVar1;
  local_1218 = "version";
  local_1220 = pvVar4;
  if (pvVar4 == (void *)0x0) {
    local_11f9 = 0;
  }
  else {
    bVar10 = false;
    if (pyVar2 != (yyjson_mut_doc *)0x0) {
      local_cd8 = pyVar1;
      if (pyVar1 == (yyjson_mut_val *)0x0) {
        bVar9 = false;
      }
      else {
        local_cd0 = pyVar1;
        local_cc0 = pyVar1;
        local_cc1 = (byte)pyVar1->tag;
        bVar9 = (local_cc1 & 7) == 7;
      }
      bVar10 = false;
      if (bVar9) {
        bVar10 = true;
      }
    }
    if (bVar10) {
      local_e08 = pyVar2;
      local_e10 = 2;
      local_e20 = &pyVar2->alc;
      local_e28 = &pyVar2->val_pool;
      if (((ulong)(((long)(pyVar2->val_pool).end - (long)local_e28->cur) / 0x18) < 2) &&
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_e28,local_e20,2),
         ((bVar3 ^ 0xff) & 1) != 0)) {
        local_e00 = (yyjson_mut_val *)0x0;
      }
      else {
        local_e18 = local_e28->cur;
        local_e28->cur = local_e28->cur + local_e10;
        local_e00 = local_e18;
      }
      local_1230 = local_e00;
      if (local_e00 != (yyjson_mut_val *)0x0) {
        local_ef8 = local_1210;
        local_1238 = local_1210->tag >> 8;
        local_1240 = local_e00 + 1;
        local_1248 = strlen(local_1218);
        local_bc8 = local_1218;
        local_bb9 = 0;
        local_1249 = 0;
        local_1230->tag = 5;
        local_1230->tag = local_1230->tag;
        local_bd0 = local_1248;
        sVar5 = strlen(local_1218);
        local_1230->tag = sVar5 << 8 | local_1230->tag;
        (local_1230->uni).str = local_1218;
        local_b40 = local_1208;
        local_b48 = local_1220;
        local_b50 = local_1228;
        local_938 = local_1208;
        local_940 = local_1228;
        local_950 = &local_1208->alc;
        local_958 = &local_1208->str_pool;
        if ((local_1228 < (ulong)((long)(local_1208->str_pool).end - (long)local_958->cur)) ||
           (bVar3 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(local_958,local_950,local_1228 + 1),
           ((bVar3 ^ 0xff) & 1) == 0)) {
          local_948 = local_958->cur;
          local_958->cur = local_948 + local_940 + 1;
          local_930 = local_948;
        }
        else {
          local_930 = (char *)0x0;
        }
        local_b58 = local_930;
        if (local_930 == (char *)0x0) {
          local_b38 = (char *)0x0;
        }
        else {
          memcpy(local_930,local_b48,local_b50);
          local_b58[local_b50] = '\0';
          local_b38 = local_b58;
        }
        (local_1240->uni).ptr = local_b38;
        if ((local_1240->uni).u64 == 0) {
          local_11f9 = 0;
        }
        else {
          local_1240->tag = local_1228 << 8 | 5;
          local_9c0 = local_1210;
          local_9c8 = local_1230;
          local_9d0 = local_1240;
          local_9d8 = local_1238;
          if (local_1238 == 0) {
            local_1240->next = local_1230;
          }
          else {
            local_9e0 = *(long *)((local_1210->uni).u64 + 0x10);
            local_9e8 = *(yyjson_mut_val **)(local_9e0 + 0x10);
            *(yyjson_mut_val **)(local_9e0 + 0x10) = local_1230;
            local_1240->next = local_9e8;
          }
          local_1230->next = local_1240;
          (local_1210->uni).u64 = (uint64_t)local_1230;
          local_8d8 = local_1238 + 1;
          local_8d0 = local_1210;
          local_8e0 = local_8d8 * 0x100 | local_1210->tag & 0xff;
          local_1210->tag = local_8e0;
          local_11f9 = 1;
        }
        goto LAB_006e65cc;
      }
    }
    local_11f9 = 0;
  }
LAB_006e65cc:
  pyVar2 = local_1328;
  pyVar1 = local_1330;
  pvVar4 = (void *)std::__cxx11::string::c_str();
  local_1278 = std::__cxx11::string::size();
  local_1258 = pyVar2;
  local_1260 = pyVar1;
  local_1268 = "primary_column";
  local_1270 = pvVar4;
  if (pvVar4 == (void *)0x0) {
    local_124a = 0;
  }
  else {
    bVar10 = false;
    if (pyVar2 != (yyjson_mut_doc *)0x0) {
      local_cb8 = pyVar1;
      if (pyVar1 == (yyjson_mut_val *)0x0) {
        bVar9 = false;
      }
      else {
        local_cb0 = pyVar1;
        local_ca0 = pyVar1;
        local_ca1 = (byte)pyVar1->tag;
        bVar9 = (local_ca1 & 7) == 7;
      }
      bVar10 = false;
      if (bVar9) {
        bVar10 = true;
      }
    }
    if (bVar10) {
      local_dd8 = pyVar2;
      local_de0 = 2;
      local_df0 = &pyVar2->alc;
      local_df8 = &pyVar2->val_pool;
      if (((ulong)(((long)(pyVar2->val_pool).end - (long)local_df8->cur) / 0x18) < 2) &&
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_df8,local_df0,2),
         ((bVar3 ^ 0xff) & 1) != 0)) {
        local_dd0 = (yyjson_mut_val *)0x0;
      }
      else {
        local_de8 = local_df8->cur;
        local_df8->cur = local_df8->cur + local_de0;
        local_dd0 = local_de8;
      }
      local_1280 = local_dd0;
      if (local_dd0 != (yyjson_mut_val *)0x0) {
        local_ef0 = local_1260;
        local_1288 = local_1260->tag >> 8;
        local_1290 = local_dd0 + 1;
        local_1298 = strlen(local_1268);
        local_b90 = local_1268;
        local_b81 = 0;
        local_1299 = 0;
        local_1280->tag = 5;
        local_1280->tag = local_1280->tag;
        local_b98 = local_1298;
        sVar5 = strlen(local_1268);
        local_1280->tag = sVar5 << 8 | local_1280->tag;
        (local_1280->uni).str = local_1268;
        local_b18 = local_1258;
        local_b20 = local_1270;
        local_b28 = local_1278;
        local_968 = local_1258;
        local_970 = local_1278;
        local_980 = &local_1258->alc;
        local_988 = &local_1258->str_pool;
        if ((local_1278 < (ulong)((long)(local_1258->str_pool).end - (long)local_988->cur)) ||
           (bVar3 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(local_988,local_980,local_1278 + 1),
           ((bVar3 ^ 0xff) & 1) == 0)) {
          local_978 = local_988->cur;
          local_988->cur = local_978 + local_970 + 1;
          local_960 = local_978;
        }
        else {
          local_960 = (char *)0x0;
        }
        local_b30 = local_960;
        if (local_960 == (char *)0x0) {
          local_b10 = (char *)0x0;
        }
        else {
          memcpy(local_960,local_b20,local_b28);
          local_b30[local_b28] = '\0';
          local_b10 = local_b30;
        }
        (local_1290->uni).ptr = local_b10;
        if ((local_1290->uni).u64 == 0) {
          local_124a = 0;
        }
        else {
          local_1290->tag = local_1278 << 8 | 5;
          local_990 = local_1260;
          local_998 = local_1280;
          local_9a0 = local_1290;
          local_9a8 = local_1288;
          if (local_1288 == 0) {
            local_1290->next = local_1280;
          }
          else {
            local_9b0 = *(long *)((local_1260->uni).u64 + 0x10);
            local_9b8 = *(yyjson_mut_val **)(local_9b0 + 0x10);
            *(yyjson_mut_val **)(local_9b0 + 0x10) = local_1280;
            local_1290->next = local_9b8;
          }
          local_1280->next = local_1290;
          (local_1260->uni).u64 = (uint64_t)local_1280;
          local_8f0 = local_1288 + 1;
          local_8e8 = local_1260;
          local_8f8 = local_8f0 * 0x100 | local_1260->tag & 0xff;
          local_1260->tag = local_8f8;
          local_124a = 1;
        }
        goto LAB_006e6cb1;
      }
    }
    local_124a = 0;
  }
LAB_006e6cb1:
  local_1198 = local_1328;
  local_11a0 = local_1330;
  local_11a8 = "columns";
  local_650 = local_1328;
  local_658 = "columns";
  if (local_1328 == (yyjson_mut_doc *)0x0) {
LAB_006e6f1a:
    local_648 = (yyjson_mut_val *)0x0;
  }
  else {
    local_660 = strlen("columns");
    local_5e8 = local_658;
    local_5d9 = 0;
    local_661 = 0;
    local_662 = 0;
    local_620 = local_650;
    local_628 = 1;
    local_638 = &local_650->alc;
    local_640 = &local_650->val_pool;
    local_5f0 = local_660;
    if ((((long)(local_650->val_pool).end - (long)local_640->cur) / 0x18 == 0) &&
       (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_640,local_638,1),
       ((bVar3 ^ 0xff) & 1) != 0)) {
      local_618 = (yyjson_mut_val *)0x0;
    }
    else {
      local_630 = local_640->cur;
      local_640->cur = local_640->cur + local_628;
      local_618 = local_630;
    }
    local_670 = local_618;
    if (local_618 == (yyjson_mut_val *)0x0) goto LAB_006e6f1a;
    local_618->tag = local_660 << 8 | (long)(int)(local_662 | 5);
    (local_618->uni).str = local_658;
    local_648 = local_618;
  }
  local_11b0 = local_648;
  local_1188 = local_1198;
  if (local_1198 != (yyjson_mut_doc *)0x0) {
    local_e68 = local_1198;
    local_e70 = 1;
    local_e80 = &local_1198->alc;
    local_e88 = &local_1198->val_pool;
    if ((((long)(local_1198->val_pool).end - (long)local_e88->cur) / 0x18 == 0) &&
       (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_e88,local_e80,1),
       ((bVar3 ^ 0xff) & 1) != 0)) {
      local_e60 = (yyjson_mut_val *)0x0;
    }
    else {
      local_e78 = local_e88->cur;
      local_e88->cur = local_e88->cur + local_e70;
      local_e60 = local_e78;
    }
    local_1190 = local_e60;
    if (local_e60 != (yyjson_mut_val *)0x0) {
      local_e60->tag = 7;
      local_1180 = local_e60;
      goto LAB_006e7097;
    }
  }
  local_1180 = (yyjson_mut_val *)0x0;
LAB_006e7097:
  local_11b8 = local_1180;
  local_f78 = local_11a0;
  local_f80 = local_11b0;
  local_f88 = local_1180;
  local_d58 = local_11a0;
  if (local_11a0 == (yyjson_mut_val *)0x0) {
    bVar10 = false;
  }
  else {
    local_d50 = local_11a0;
    local_d40 = local_11a0;
    local_d41 = (byte)local_11a0->tag;
    bVar10 = (local_d41 & 7) == 7;
  }
  bVar9 = false;
  if (bVar10) {
    local_60 = local_11b0;
    if (local_11b0 == (yyjson_mut_val *)0x0) {
      bVar10 = false;
    }
    else {
      local_58 = local_11b0;
      local_48 = local_11b0;
      local_49 = (byte)local_11b0->tag;
      bVar10 = (local_49 & 7) == 5;
    }
    bVar9 = false;
    if (bVar10) {
      bVar9 = local_1180 != (yyjson_mut_val *)0x0;
    }
  }
  if (bVar9) {
    local_f18 = local_11a0;
    local_a98 = local_11a0->tag >> 8;
    local_a80 = local_11a0;
    local_a88 = local_11b0;
    local_a90 = local_1180;
    if (local_a98 == 0) {
      local_1180->next = local_11b0;
    }
    else {
      local_aa0 = *(long *)((local_11a0->uni).u64 + 0x10);
      local_aa8 = *(yyjson_mut_val **)(local_aa0 + 0x10);
      *(yyjson_mut_val **)(local_aa0 + 0x10) = local_11b0;
      local_1180->next = local_aa8;
    }
    local_11b0->next = local_1180;
    (local_11a0->uni).str = (char *)local_11b0;
    local_878 = local_a98 + 1;
    local_870 = local_11a0;
    local_880 = local_878 * 0x100 | local_11a0->tag & 0xff;
    local_11a0->tag = local_880;
    local_f69 = '\x01';
  }
  else {
    local_f69 = '\0';
  }
  if (local_f69 == '\0') {
    local_1530 = (yyjson_mut_val *)0x0;
  }
  else {
    local_1530 = local_1180;
  }
  local_1338 = local_1530;
  local_1340 = in_RDI + 0x68;
  local_1348._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>_>
                *)in_stack_ffffffffffffea08);
  local_1350._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>_>
              *)in_stack_ffffffffffffea08);
  do {
    bVar10 = std::__detail::operator!=(&local_1348,&local_1350);
    if (!bVar10) {
      local_1410 = (KeyValue *)
                   duckdb_yyjson::yyjson_mut_write_opts
                             (local_1328,0,(yyjson_alc *)0x0,(ulong *)&local_1408,&local_1400);
      if (local_1410 == (KeyValue *)0x0) {
        duckdb_yyjson::yyjson_mut_doc_free(local_1328);
        local_1432 = 1;
        uVar8 = __cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1430,"Failed to write JSON string: %s",&local_1431);
        SerializationException::SerializationException<char_const*>
                  (in_stack_ffffffffffffea50,(string *)in_stack_ffffffffffffea48,
                   (char *)CONCAT17(in_stack_ffffffffffffea47,
                                    CONCAT16(in_stack_ffffffffffffea46,
                                             CONCAT15(in_stack_ffffffffffffea45,
                                                      CONCAT14(in_stack_ffffffffffffea44,
                                                               CONCAT13(in_stack_ffffffffffffea43,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffea42,
                                                  CONCAT11(in_stack_ffffffffffffea41,
                                                           in_stack_ffffffffffffea40))))))));
        local_1432 = 0;
        __cxa_throw(uVar8,&SerializationException::typeinfo,
                    SerializationException::~SerializationException);
      }
      duckdb_parquet::KeyValue::KeyValue(in_stack_ffffffffffffea10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_14a8,"geo",&local_14a9);
      duckdb_parquet::KeyValue::__set_key(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
      std::__cxx11::string::~string(local_14a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_14a9);
      this_02 = &local_14d1;
      this_01 = local_1410;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_14d0,(char *)this_01,(ulong)local_1408,this_02);
      duckdb_parquet::KeyValue::__set_value(this_01,in_stack_ffffffffffffea08);
      std::__cxx11::string::~string(local_14d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_14d1);
      free(local_1410);
      duckdb_yyjson::yyjson_mut_doc_free(local_1328);
      std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::push_back
                ((vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_> *)
                 this_02,local_1408);
      *(byte *)(local_1320 + 0x168) = *(byte *)(local_1320 + 0x168) & 0xfe | 1;
      duckdb_parquet::KeyValue::~KeyValue(this_01);
      return;
    }
    local_1358 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_false,_true>
                 ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_false,_true>
                              *)0x6e7431);
    pyVar2 = local_1328;
    pyVar1 = local_1338;
    local_11e8 = (char *)std::__cxx11::string::c_str();
    local_11d8 = pyVar2;
    local_11e0 = pyVar1;
    local_5b8 = pyVar2;
    local_1531 = pyVar2 == (yyjson_mut_doc *)0x0 || local_11e8 == (char *)0x0;
    local_5c0 = local_11e8;
    if (local_1531) {
LAB_006e76c8:
      local_5b0 = (yyjson_mut_val *)0x0;
    }
    else {
      local_5c8 = strlen(local_11e8);
      local_550 = local_5c0;
      local_541 = 0;
      local_5c9 = 0;
      local_5ca = 0;
      local_588 = local_5b8;
      local_590 = 1;
      local_5a0 = &local_5b8->alc;
      local_5a8 = &local_5b8->val_pool;
      local_558 = local_5c8;
      if ((((long)(local_5b8->val_pool).end - (long)local_5a8->cur) / 0x18 == 0) &&
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_5a8,local_5a0,1),
         ((bVar3 ^ 0xff) & 1) != 0)) {
        local_580 = (yyjson_mut_val *)0x0;
      }
      else {
        local_598 = local_5a8->cur;
        local_5a8->cur = local_5a8->cur + local_590;
        local_580 = local_598;
      }
      local_5d8 = local_580;
      if (local_580 == (yyjson_mut_val *)0x0) goto LAB_006e76c8;
      local_580->tag = local_5c8 << 8 | (long)(int)(local_5ca | 5);
      (local_580->uni).str = local_5c0;
      local_5b0 = local_580;
    }
    local_11f0 = local_5b0;
    local_11c8 = local_11d8;
    if (local_11d8 == (yyjson_mut_doc *)0x0) {
LAB_006e7839:
      local_11c0 = (yyjson_mut_val *)0x0;
    }
    else {
      local_e38 = local_11d8;
      local_e40 = 1;
      local_e50 = &local_11d8->alc;
      local_e58 = &local_11d8->val_pool;
      if ((((long)(local_11d8->val_pool).end - (long)local_e58->cur) / 0x18 == 0) &&
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_e58,local_e50,1),
         ((bVar3 ^ 0xff) & 1) != 0)) {
        local_e30 = (yyjson_mut_val *)0x0;
      }
      else {
        local_e48 = local_e58->cur;
        local_e58->cur = local_e58->cur + local_e40;
        local_e30 = local_e48;
      }
      local_11d0 = local_e30;
      if (local_e30 == (yyjson_mut_val *)0x0) goto LAB_006e7839;
      local_e30->tag = 7;
      local_11c0 = local_e30;
    }
    local_11f8 = local_11c0;
    local_f58 = local_11e0;
    local_f60 = local_11f0;
    local_f68 = local_11c0;
    local_d78 = local_11e0;
    if (local_11e0 == (yyjson_mut_val *)0x0) {
      bVar10 = false;
    }
    else {
      local_d70 = local_11e0;
      local_d60 = local_11e0;
      local_d61 = (byte)local_11e0->tag;
      bVar10 = (local_d61 & 7) == 7;
    }
    bVar9 = false;
    if (bVar10) {
      local_80 = local_11f0;
      if (local_11f0 == (yyjson_mut_val *)0x0) {
        bVar10 = false;
      }
      else {
        local_78 = local_11f0;
        local_68 = local_11f0;
        local_69 = (byte)local_11f0->tag;
        bVar10 = (local_69 & 7) == 5;
      }
      bVar9 = false;
      if (bVar10) {
        bVar9 = local_11c0 != (yyjson_mut_val *)0x0;
      }
    }
    if (bVar9) {
      local_f20 = local_11e0;
      local_ac8 = local_11e0->tag >> 8;
      local_ab0 = local_11e0;
      local_ab8 = local_11f0;
      local_ac0 = local_11c0;
      if (local_ac8 == 0) {
        local_11c0->next = local_11f0;
      }
      else {
        local_ad0 = *(long *)((local_11e0->uni).u64 + 0x10);
        local_ad8 = *(yyjson_mut_val **)(local_ad0 + 0x10);
        *(yyjson_mut_val **)(local_ad0 + 0x10) = local_11f0;
        local_11c0->next = local_ad8;
      }
      local_11f0->next = local_11c0;
      (local_11e0->uni).str = (char *)local_11f0;
      local_860 = local_ac8 + 1;
      local_858 = local_11e0;
      local_868 = local_860 * 0x100 | local_11e0->tag & 0xff;
      local_11e0->tag = local_868;
      local_f49 = '\x01';
    }
    else {
      local_f49 = '\0';
    }
    if (local_f49 == '\0') {
      local_1558 = (yyjson_mut_val *)0x0;
    }
    else {
      local_1558 = local_11c0;
    }
    local_1360 = local_1558;
    local_1128 = local_1328;
    local_1130 = local_1558;
    local_1138 = "encoding";
    local_1140 = "WKB";
    bVar10 = false;
    if (local_1328 != (yyjson_mut_doc *)0x0) {
      local_cf8 = local_1558;
      if (local_1558 == (yyjson_mut_val *)0x0) {
        bVar9 = false;
      }
      else {
        local_cf0 = local_1558;
        local_ce0 = local_1558;
        local_ce1 = (byte)local_1558->tag;
        bVar9 = (local_ce1 & 7) == 7;
      }
      bVar10 = false;
      if (bVar9) {
        bVar10 = true;
      }
    }
    if (bVar10) {
      local_e98 = local_1328;
      local_ea0 = 2;
      local_eb0 = &local_1328->alc;
      local_eb8 = &local_1328->val_pool;
      if (((ulong)(((long)(local_1328->val_pool).end - (long)local_eb8->cur) / 0x18) < 2) &&
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_eb8,local_eb0,2),
         ((bVar3 ^ 0xff) & 1) != 0)) {
        local_e90 = (yyjson_mut_val *)0x0;
      }
      else {
        local_ea8 = local_eb8->cur;
        local_eb8->cur = local_eb8->cur + local_ea0;
        local_e90 = local_ea8;
      }
      local_1148 = local_e90;
      if (local_e90 == (yyjson_mut_val *)0x0) goto LAB_006e80e5;
      local_f00 = local_1130;
      local_1150 = local_1130->tag >> 8;
      local_1158 = local_e90 + 1;
      local_1160 = strlen(local_1138);
      local_c00 = local_1138;
      local_bf1 = 0;
      local_1161 = 0;
      local_1148->tag = 5;
      local_1148->tag = local_1148->tag;
      local_c08 = local_1160;
      sVar5 = strlen(local_1138);
      local_1148->tag = sVar5 << 8 | local_1148->tag;
      (local_1148->uni).str = local_1138;
      local_1170 = strlen(local_1140);
      local_c38 = local_1140;
      local_c29 = 0;
      local_1171 = 0;
      local_c40 = local_1170;
      sVar5 = strlen(local_1140);
      local_1158->tag = sVar5 << 8 | 5;
      local_155d = 8;
      if ((local_1171 & 1) == 0) {
        local_155d = 0;
      }
      local_1158->tag = (ulong)local_155d | local_1158->tag;
      (local_1158->uni).str = local_1140;
      local_9f0 = local_1130;
      local_9f8 = local_1148;
      local_a00 = local_1158;
      local_a08 = local_1150;
      if (local_1150 == 0) {
        local_1158->next = local_1148;
      }
      else {
        local_a10 = *(long *)((local_1130->uni).u64 + 0x10);
        local_a18 = *(yyjson_mut_val **)(local_a10 + 0x10);
        *(yyjson_mut_val **)(local_a10 + 0x10) = local_1148;
        local_1158->next = local_a18;
      }
      local_1148->next = local_1158;
      (local_1130->uni).str = (char *)local_1148;
      local_8c0 = local_1150 + 1;
      local_8b8 = local_1130;
      local_8c8 = local_8c0 * 0x100 | local_1130->tag & 0xff;
      local_1130->tag = local_8c8;
      local_1119 = 1;
    }
    else {
LAB_006e80e5:
      local_1119 = 0;
    }
    local_10d0 = local_1328;
    local_10d8 = local_1360;
    local_10e0 = "geometry_types";
    local_780 = local_1328;
    local_788 = "geometry_types";
    if (local_1328 == (yyjson_mut_doc *)0x0) {
LAB_006e8356:
      local_778 = (yyjson_mut_val *)0x0;
    }
    else {
      local_790 = strlen("geometry_types");
      local_718 = local_788;
      local_709 = 0;
      local_791 = 0;
      local_792 = 0;
      local_750 = local_780;
      local_758 = 1;
      local_768 = &local_780->alc;
      local_770 = &local_780->val_pool;
      local_720 = local_790;
      if ((((long)(local_780->val_pool).end - (long)local_770->cur) / 0x18 == 0) &&
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_770,local_768,1),
         ((bVar3 ^ 0xff) & 1) != 0)) {
        local_748 = (yyjson_mut_val *)0x0;
      }
      else {
        local_760 = local_770->cur;
        local_770->cur = local_770->cur + local_758;
        local_748 = local_760;
      }
      local_7a0 = local_748;
      if (local_748 == (yyjson_mut_val *)0x0) goto LAB_006e8356;
      local_748->tag = local_790 << 8 | (long)(int)(local_792 | 5);
      (local_748->uni).str = local_788;
      local_778 = local_748;
    }
    local_10e8 = local_778;
    local_538 = local_10d0;
    if (local_10d0 == (yyjson_mut_doc *)0x0) {
LAB_006e84c7:
      local_530 = (yyjson_mut_val *)0x0;
    }
    else {
      local_508 = local_10d0;
      local_510 = 1;
      local_520 = &local_10d0->alc;
      local_528 = &local_10d0->val_pool;
      if ((((long)(local_10d0->val_pool).end - (long)local_528->cur) / 0x18 == 0) &&
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_528,local_520,1),
         ((bVar3 ^ 0xff) & 1) != 0)) {
        local_500 = (yyjson_mut_val *)0x0;
      }
      else {
        local_518 = local_528->cur;
        local_528->cur = local_528->cur + local_510;
        local_500 = local_518;
      }
      local_540 = local_500;
      if (local_500 == (yyjson_mut_val *)0x0) goto LAB_006e84c7;
      local_500->tag = 6;
      local_530 = local_500;
    }
    local_10f0 = local_530;
    local_fb8 = local_10d8;
    local_fc0 = local_10e8;
    local_fc8 = local_530;
    local_d18 = local_10d8;
    if (local_10d8 == (yyjson_mut_val *)0x0) {
      bVar10 = false;
    }
    else {
      local_d10 = local_10d8;
      local_d00 = local_10d8;
      local_d01 = (byte)local_10d8->tag;
      bVar10 = (local_d01 & 7) == 7;
    }
    bVar9 = false;
    if (bVar10) {
      local_20 = local_10e8;
      if (local_10e8 == (yyjson_mut_val *)0x0) {
        bVar10 = false;
      }
      else {
        local_18 = local_10e8;
        local_8 = local_10e8;
        local_9 = (byte)local_10e8->tag;
        bVar10 = (local_9 & 7) == 5;
      }
      bVar9 = false;
      if (bVar10) {
        bVar9 = local_530 != (yyjson_mut_val *)0x0;
      }
    }
    if (bVar9) {
      local_f08 = local_10d8;
      local_a38 = local_10d8->tag >> 8;
      local_a20 = local_10d8;
      local_a28 = local_10e8;
      local_a30 = local_530;
      if (local_a38 == 0) {
        local_530->next = local_10e8;
      }
      else {
        local_a40 = *(long *)((local_10d8->uni).u64 + 0x10);
        local_a48 = *(yyjson_mut_val **)(local_a40 + 0x10);
        *(yyjson_mut_val **)(local_a40 + 0x10) = local_10e8;
        local_530->next = local_a48;
      }
      local_10e8->next = local_530;
      (local_10d8->uni).str = (char *)local_10e8;
      local_8a8 = local_a38 + 1;
      local_8a0 = local_10d8;
      local_8b0 = local_8a8 * 0x100 | local_10d8->tag & 0xff;
      local_10d8->tag = local_8b0;
      local_fa9 = '\x01';
    }
    else {
      local_fa9 = '\0';
    }
    if (local_fa9 == '\0') {
      local_1570 = (yyjson_mut_val *)0x0;
    }
    else {
      local_1570 = local_530;
    }
    local_1368 = local_1570;
    local_1370 = &(local_1358->second).geometry_types;
    local_1378._M_node =
         (_Base_ptr)
         std::
         set<duckdb::WKBGeometryType,_std::less<duckdb::WKBGeometryType>,_std::allocator<duckdb::WKBGeometryType>_>
         ::begin((set<duckdb::WKBGeometryType,_std::less<duckdb::WKBGeometryType>,_std::allocator<duckdb::WKBGeometryType>_>
                  *)in_stack_ffffffffffffea08);
    local_1380._M_node =
         (_Base_ptr)
         std::
         set<duckdb::WKBGeometryType,_std::less<duckdb::WKBGeometryType>,_std::allocator<duckdb::WKBGeometryType>_>
         ::end((set<duckdb::WKBGeometryType,_std::less<duckdb::WKBGeometryType>,_std::allocator<duckdb::WKBGeometryType>_>
                *)in_stack_ffffffffffffea08);
    while (bVar10 = std::operator!=(&local_1378,&local_1380), bVar10) {
      local_1388 = std::_Rb_tree_const_iterator<duckdb::WKBGeometryType>::operator*
                             ((_Rb_tree_const_iterator<duckdb::WKBGeometryType> *)0x6e8871);
      local_1390 = WKBGeometryTypes::ToString
                             ((WKBGeometryType)((ulong)in_stack_ffffffffffffea48 >> 0x30));
      local_10b0 = local_1328;
      local_10b8 = local_1368;
      bVar10 = false;
      if (local_1328 != (yyjson_mut_doc *)0x0) {
        local_430 = local_1368;
        if (local_1368 == (yyjson_mut_val *)0x0) {
          bVar10 = false;
        }
        else {
          local_428 = local_1368;
          local_418 = local_1368;
          local_419 = (byte)local_1368->tag;
          bVar10 = (local_419 & 7) == 6;
        }
      }
      local_10c0 = local_1390;
      if (bVar10) {
        local_818 = local_1328;
        local_1573 = local_1328 == (yyjson_mut_doc *)0x0 || local_1390 == (char *)0x0;
        local_820 = local_1390;
        if (local_1573) {
LAB_006e8ba6:
          local_810 = (yyjson_mut_val *)0x0;
        }
        else {
          local_828 = strlen(local_1390);
          local_7b0 = local_820;
          local_7a1 = 0;
          local_829 = 0;
          local_82a = 0;
          local_7e8 = local_818;
          local_7f0 = 1;
          local_800 = &local_818->alc;
          local_808 = &local_818->val_pool;
          local_7b8 = local_828;
          if ((((long)(local_818->val_pool).end - (long)local_808->cur) / 0x18 == 0) &&
             (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_808,local_800,1),
             ((bVar3 ^ 0xff) & 1) != 0)) {
            local_7e0 = (yyjson_mut_val *)0x0;
          }
          else {
            local_7f8 = local_808->cur;
            local_808->cur = local_808->cur + local_7f0;
            local_7e0 = local_7f8;
          }
          local_838 = local_7e0;
          if (local_7e0 == (yyjson_mut_val *)0x0) goto LAB_006e8ba6;
          local_7e0->tag = local_828 << 8 | (long)(int)(local_82a | 5);
          (local_7e0->uni).str = local_820;
          local_810 = local_7e0;
        }
        local_10c8 = local_810;
        local_230 = local_10b8;
        local_238 = local_810;
        local_200 = local_10b8;
        if (local_10b8 == (yyjson_mut_val *)0x0) {
          local_1577 = false;
        }
        else {
          local_1f8 = local_10b8;
          local_1e8 = local_10b8;
          local_1e9 = (byte)local_10b8->tag;
          local_1577 = (local_1e9 & 7) == 6;
        }
        local_1577 = local_1577 && local_810 != (yyjson_mut_val *)0x0;
        if (local_1577) {
          local_220 = local_10b8;
          local_240 = local_10b8->tag >> 8;
          local_210 = local_240 + 1;
          local_208 = local_10b8;
          local_218 = local_210 * 0x100 | local_10b8->tag & 0xff;
          local_10b8->tag = local_218;
          if (local_240 == 0) {
            local_810->next = local_810;
          }
          else {
            local_248 = (local_10b8->uni).u64;
            local_250 = *(yyjson_mut_val **)(local_248 + 0x10);
            *(yyjson_mut_val **)(local_248 + 0x10) = local_810;
            local_810->next = local_250;
          }
          (local_10b8->uni).u64 = (uint64_t)local_810;
          local_221 = 1;
        }
        else {
          local_221 = 0;
        }
        local_10a1 = local_221;
      }
      else {
        local_10a1 = 0;
      }
      std::_Rb_tree_const_iterator<duckdb::WKBGeometryType>::operator++
                ((_Rb_tree_const_iterator<duckdb::WKBGeometryType> *)in_stack_ffffffffffffea10);
    }
    local_10f8 = local_1328;
    local_1100 = local_1360;
    local_1108 = "bbox";
    local_6e8 = local_1328;
    local_6f0 = "bbox";
    if (local_1328 == (yyjson_mut_doc *)0x0) {
LAB_006e9041:
      local_6e0 = (yyjson_mut_val *)0x0;
    }
    else {
      local_6f8 = strlen("bbox");
      local_680 = local_6f0;
      local_671 = 0;
      local_6f9 = 0;
      local_6fa = 0;
      local_6b8 = local_6e8;
      local_6c0 = 1;
      local_6d0 = &local_6e8->alc;
      local_6d8 = &local_6e8->val_pool;
      local_688 = local_6f8;
      if ((((long)(local_6e8->val_pool).end - (long)local_6d8->cur) / 0x18 == 0) &&
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_6d8,local_6d0,1),
         ((bVar3 ^ 0xff) & 1) != 0)) {
        local_6b0 = (yyjson_mut_val *)0x0;
      }
      else {
        local_6c8 = local_6d8->cur;
        local_6d8->cur = local_6d8->cur + local_6c0;
        local_6b0 = local_6c8;
      }
      local_708 = local_6b0;
      if (local_6b0 == (yyjson_mut_val *)0x0) goto LAB_006e9041;
      local_6b0->tag = local_6f8 << 8 | (long)(int)(local_6fa | 5);
      (local_6b0->uni).str = local_6f0;
      local_6e0 = local_6b0;
    }
    local_1110 = local_6e0;
    local_4f0 = local_10f8;
    if (local_10f8 == (yyjson_mut_doc *)0x0) {
LAB_006e91b2:
      local_4e8 = (yyjson_mut_val *)0x0;
    }
    else {
      local_4c0 = local_10f8;
      local_4c8 = 1;
      local_4d8 = &local_10f8->alc;
      local_4e0 = &local_10f8->val_pool;
      if ((((long)(local_10f8->val_pool).end - (long)local_4e0->cur) / 0x18 == 0) &&
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_4e0,local_4d8,1),
         ((bVar3 ^ 0xff) & 1) != 0)) {
        local_4b8 = (yyjson_mut_val *)0x0;
      }
      else {
        local_4d0 = local_4e0->cur;
        local_4e0->cur = local_4e0->cur + local_4c8;
        local_4b8 = local_4d0;
      }
      local_4f8 = local_4b8;
      if (local_4b8 == (yyjson_mut_val *)0x0) goto LAB_006e91b2;
      local_4b8->tag = 6;
      local_4e8 = local_4b8;
    }
    local_1118 = local_4e8;
    local_f98 = local_1100;
    local_fa0 = local_1110;
    local_fa8 = local_4e8;
    local_d38 = local_1100;
    if (local_1100 == (yyjson_mut_val *)0x0) {
      bVar10 = false;
    }
    else {
      local_d30 = local_1100;
      local_d20 = local_1100;
      local_d21 = (byte)local_1100->tag;
      bVar10 = (local_d21 & 7) == 7;
    }
    bVar9 = false;
    if (bVar10) {
      local_40 = local_1110;
      if (local_1110 == (yyjson_mut_val *)0x0) {
        bVar10 = false;
      }
      else {
        local_38 = local_1110;
        local_28 = local_1110;
        local_29 = (byte)local_1110->tag;
        bVar10 = (local_29 & 7) == 5;
      }
      bVar9 = false;
      if (bVar10) {
        bVar9 = local_4e8 != (yyjson_mut_val *)0x0;
      }
    }
    if (bVar9) {
      local_f10 = local_1100;
      local_a68 = local_1100->tag >> 8;
      local_a50 = local_1100;
      local_a58 = local_1110;
      local_a60 = local_4e8;
      if (local_a68 == 0) {
        local_4e8->next = local_1110;
      }
      else {
        local_a70 = *(long *)((local_1100->uni).u64 + 0x10);
        local_a78 = *(yyjson_mut_val **)(local_a70 + 0x10);
        *(yyjson_mut_val **)(local_a70 + 0x10) = local_1110;
        local_4e8->next = local_a78;
      }
      local_1110->next = local_4e8;
      (local_1100->uni).str = (char *)local_1110;
      local_890 = local_a68 + 1;
      local_888 = local_1100;
      local_898 = local_890 * 0x100 | local_1100->tag & 0xff;
      local_1100->tag = local_898;
      local_f89 = '\x01';
    }
    else {
      local_f89 = '\0';
    }
    if (local_f89 == '\0') {
      local_1588 = (yyjson_mut_val *)0x0;
    }
    else {
      local_1588 = local_4e8;
    }
    local_1398 = local_1588;
    local_1020 = (yyjson_val_uni)(local_1358->second).bbox.min_x;
    local_1010 = local_1328;
    local_1018 = local_1588;
    bVar10 = false;
    if (local_1328 != (yyjson_mut_doc *)0x0) {
      local_4b0 = local_1588;
      if (local_1588 == (yyjson_mut_val *)0x0) {
        bVar10 = false;
      }
      else {
        local_4a8 = local_1588;
        local_498 = local_1588;
        local_499 = (byte)local_1588->tag;
        bVar10 = (local_499 & 7) == 6;
      }
    }
    if (bVar10) {
      local_1d0 = local_1328;
      local_1d8 = local_1020;
      if (local_1328 == (yyjson_mut_doc *)0x0) {
LAB_006e9710:
        local_1c8 = (yyjson_mut_val *)0x0;
      }
      else {
        local_1a0 = local_1328;
        local_1a8 = 1;
        local_1b8 = &local_1328->alc;
        local_1c0 = &local_1328->val_pool;
        if ((((long)(local_1328->val_pool).end - (long)local_1c0->cur) / 0x18 == 0) &&
           (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_1c0,local_1b8,1),
           ((bVar3 ^ 0xff) & 1) != 0)) {
          local_198 = (yyjson_mut_val *)0x0;
        }
        else {
          local_1b0 = local_1c0->cur;
          local_1c0->cur = local_1c0->cur + local_1a8;
          local_198 = local_1b0;
        }
        local_1e0 = local_198;
        if (local_198 == (yyjson_mut_val *)0x0) goto LAB_006e9710;
        local_198->tag = 0x14;
        local_198->uni = local_1d8;
        local_1c8 = local_198;
      }
      local_1028 = local_1c8;
      local_3f0 = local_1018;
      local_3f8 = local_1c8;
      local_3c0 = local_1018;
      if (local_1018 == (yyjson_mut_val *)0x0) {
        local_158c = false;
      }
      else {
        local_3b8 = local_1018;
        local_3a8 = local_1018;
        local_3a9 = (byte)local_1018->tag;
        local_158c = (local_3a9 & 7) == 6;
      }
      local_158c = local_158c && local_1c8 != (yyjson_mut_val *)0x0;
      if (local_158c) {
        local_3e0 = local_1018;
        local_400 = local_1018->tag >> 8;
        local_3d0 = local_400 + 1;
        local_3c8 = local_1018;
        local_3d8 = local_3d0 * 0x100 | local_1018->tag & 0xff;
        local_1018->tag = local_3d8;
        if (local_400 == 0) {
          local_1c8->next = local_1c8;
        }
        else {
          local_408 = (local_1018->uni).u64;
          local_410 = *(yyjson_mut_val **)(local_408 + 0x10);
          *(yyjson_mut_val **)(local_408 + 0x10) = local_1c8;
          local_1c8->next = local_410;
        }
        (local_1018->uni).u64 = (uint64_t)local_1c8;
        local_3e1 = 1;
      }
      else {
        local_3e1 = 0;
      }
      local_1001 = local_3e1;
    }
    else {
      local_1001 = 0;
    }
    local_1048 = (yyjson_val_uni)(local_1358->second).bbox.min_y;
    local_1038 = local_1328;
    local_1040 = local_1398;
    bVar10 = false;
    if (local_1328 != (yyjson_mut_doc *)0x0) {
      local_490 = local_1398;
      if (local_1398 == (yyjson_mut_val *)0x0) {
        bVar10 = false;
      }
      else {
        local_488 = local_1398;
        local_478 = local_1398;
        local_479 = (byte)local_1398->tag;
        bVar10 = (local_479 & 7) == 6;
      }
    }
    if (bVar10) {
      local_180 = local_1328;
      local_188 = local_1048;
      if (local_1328 == (yyjson_mut_doc *)0x0) {
LAB_006e9b75:
        local_178 = (yyjson_mut_val *)0x0;
      }
      else {
        local_150 = local_1328;
        local_158 = 1;
        local_168 = &local_1328->alc;
        local_170 = &local_1328->val_pool;
        if ((((long)(local_1328->val_pool).end - (long)local_170->cur) / 0x18 == 0) &&
           (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_170,local_168,1),
           ((bVar3 ^ 0xff) & 1) != 0)) {
          local_148 = (yyjson_mut_val *)0x0;
        }
        else {
          local_160 = local_170->cur;
          local_170->cur = local_170->cur + local_158;
          local_148 = local_160;
        }
        local_190 = local_148;
        if (local_148 == (yyjson_mut_val *)0x0) goto LAB_006e9b75;
        local_148->tag = 0x14;
        local_148->uni = local_188;
        local_178 = local_148;
      }
      local_1050 = local_178;
      local_380 = local_1040;
      local_388 = local_178;
      local_350 = local_1040;
      if (local_1040 == (yyjson_mut_val *)0x0) {
        local_1590 = false;
      }
      else {
        local_348 = local_1040;
        local_338 = local_1040;
        local_339 = (byte)local_1040->tag;
        local_1590 = (local_339 & 7) == 6;
      }
      local_1590 = local_1590 && local_178 != (yyjson_mut_val *)0x0;
      if (local_1590) {
        local_370 = local_1040;
        local_390 = local_1040->tag >> 8;
        local_360 = local_390 + 1;
        local_358 = local_1040;
        local_368 = local_360 * 0x100 | local_1040->tag & 0xff;
        local_1040->tag = local_368;
        if (local_390 == 0) {
          local_178->next = local_178;
        }
        else {
          local_398 = (local_1040->uni).u64;
          local_3a0 = *(yyjson_mut_val **)(local_398 + 0x10);
          *(yyjson_mut_val **)(local_398 + 0x10) = local_178;
          local_178->next = local_3a0;
        }
        (local_1040->uni).u64 = (uint64_t)local_178;
        local_371 = 1;
      }
      else {
        local_371 = 0;
      }
      local_1029 = local_371;
    }
    else {
      local_1029 = 0;
    }
    local_1070 = (yyjson_val_uni)(local_1358->second).bbox.max_x;
    local_1060 = local_1328;
    local_1068 = local_1398;
    bVar10 = false;
    if (local_1328 != (yyjson_mut_doc *)0x0) {
      local_470 = local_1398;
      if (local_1398 == (yyjson_mut_val *)0x0) {
        bVar10 = false;
      }
      else {
        local_468 = local_1398;
        local_458 = local_1398;
        local_459 = (byte)local_1398->tag;
        bVar10 = (local_459 & 7) == 6;
      }
    }
    if (bVar10) {
      local_130 = local_1328;
      local_138 = local_1070;
      if (local_1328 == (yyjson_mut_doc *)0x0) {
LAB_006e9fda:
        local_128 = (yyjson_mut_val *)0x0;
      }
      else {
        local_100 = local_1328;
        local_108 = 1;
        local_118 = &local_1328->alc;
        local_120 = &local_1328->val_pool;
        if ((((long)(local_1328->val_pool).end - (long)local_120->cur) / 0x18 == 0) &&
           (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_120,local_118,1),
           ((bVar3 ^ 0xff) & 1) != 0)) {
          local_f8 = (yyjson_mut_val *)0x0;
        }
        else {
          local_110 = local_120->cur;
          local_120->cur = local_120->cur + local_108;
          local_f8 = local_110;
        }
        local_140 = local_f8;
        if (local_f8 == (yyjson_mut_val *)0x0) goto LAB_006e9fda;
        local_f8->tag = 0x14;
        local_f8->uni = local_138;
        local_128 = local_f8;
      }
      local_1078 = local_128;
      local_310 = local_1068;
      local_318 = local_128;
      local_2e0 = local_1068;
      if (local_1068 == (yyjson_mut_val *)0x0) {
        local_1594 = false;
      }
      else {
        local_2d8 = local_1068;
        local_2c8 = local_1068;
        local_2c9 = (byte)local_1068->tag;
        local_1594 = (local_2c9 & 7) == 6;
      }
      local_1594 = local_1594 && local_128 != (yyjson_mut_val *)0x0;
      if (local_1594) {
        local_300 = local_1068;
        local_320 = local_1068->tag >> 8;
        local_2f0 = local_320 + 1;
        local_2e8 = local_1068;
        local_2f8 = local_2f0 * 0x100 | local_1068->tag & 0xff;
        local_1068->tag = local_2f8;
        if (local_320 == 0) {
          local_128->next = local_128;
        }
        else {
          local_328 = (local_1068->uni).u64;
          local_330 = *(yyjson_mut_val **)(local_328 + 0x10);
          *(yyjson_mut_val **)(local_328 + 0x10) = local_128;
          local_128->next = local_330;
        }
        (local_1068->uni).u64 = (uint64_t)local_128;
        local_301 = 1;
      }
      else {
        local_301 = 0;
      }
      local_1051 = local_301;
    }
    else {
      local_1051 = 0;
    }
    local_1098 = (yyjson_val_uni)(local_1358->second).bbox.max_y;
    local_1088 = local_1328;
    local_1090 = local_1398;
    bVar10 = false;
    if (local_1328 != (yyjson_mut_doc *)0x0) {
      local_450 = local_1398;
      if (local_1398 == (yyjson_mut_val *)0x0) {
        bVar10 = false;
      }
      else {
        local_448 = local_1398;
        local_438 = local_1398;
        local_439 = (byte)local_1398->tag;
        bVar10 = (local_439 & 7) == 6;
      }
    }
    if (bVar10) {
      local_e0 = local_1328;
      local_e8 = local_1098;
      if (local_1328 == (yyjson_mut_doc *)0x0) {
LAB_006ea43f:
        local_d8 = (yyjson_mut_val *)0x0;
      }
      else {
        local_b0 = local_1328;
        local_b8 = 1;
        local_c8 = &local_1328->alc;
        local_d0 = &local_1328->val_pool;
        if ((((long)(local_1328->val_pool).end - (long)local_d0->cur) / 0x18 == 0) &&
           (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_d0,local_c8,1),
           ((bVar3 ^ 0xff) & 1) != 0)) {
          local_a8 = (yyjson_mut_val *)0x0;
        }
        else {
          local_c0 = local_d0->cur;
          local_d0->cur = local_d0->cur + local_b8;
          local_a8 = local_c0;
        }
        local_f0 = local_a8;
        if (local_a8 == (yyjson_mut_val *)0x0) goto LAB_006ea43f;
        local_a8->tag = 0x14;
        local_a8->uni = local_e8;
        local_d8 = local_a8;
      }
      local_10a0 = local_d8;
      local_2a0 = local_1090;
      local_2a8 = local_d8;
      local_270 = local_1090;
      if (local_1090 == (yyjson_mut_val *)0x0) {
        local_1598 = false;
      }
      else {
        local_268 = local_1090;
        local_258 = local_1090;
        local_259 = (byte)local_1090->tag;
        local_1598 = (local_259 & 7) == 6;
      }
      local_1598 = local_1598 && local_d8 != (yyjson_mut_val *)0x0;
      if (local_1598) {
        local_290 = local_1090;
        local_2b0 = local_1090->tag >> 8;
        local_280 = local_2b0 + 1;
        local_278 = local_1090;
        local_288 = local_280 * 0x100 | local_1090->tag & 0xff;
        local_1090->tag = local_288;
        if (local_2b0 == 0) {
          local_d8->next = local_d8;
        }
        else {
          local_2b8 = (local_1090->uni).u64;
          local_2c0 = *(yyjson_mut_val **)(local_2b8 + 0x10);
          *(yyjson_mut_val **)(local_2b8 + 0x10) = local_d8;
          local_d8->next = local_2c0;
        }
        (local_1090->uni).u64 = (uint64_t)local_d8;
        local_291 = 1;
      }
      else {
        local_291 = 0;
      }
      local_1079 = local_291;
    }
    else {
      local_1079 = 0;
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pcVar7 = (char *)std::__cxx11::string::c_str();
      local_1308 = std::__cxx11::string::size();
      local_130c = 0;
      local_1300 = pcVar7;
      local_13a0 = (undefined8 *)
                   duckdb_yyjson::yyjson_read_opts
                             (pcVar7,local_1308,0,(yyjson_alc *)0x0,(yyjson_read_err *)0x0);
      if (local_13a0 == (undefined8 *)0x0) {
        duckdb_yyjson::yyjson_mut_doc_free(local_1328);
        local_13d5 = 1;
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_13c0,"Failed to parse CRS JSON",&local_13c1);
        duckdb::InvalidInputException::InvalidInputException(this_00,local_13c0);
        local_13d5 = 0;
        __cxa_throw(this_00,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      if (local_13a0 == (undefined8 *)0x0) {
        in_stack_ffffffffffffea48 = (yyjson_val *)0x0;
      }
      else {
        in_stack_ffffffffffffea48 = (yyjson_val *)*local_13a0;
      }
      local_13e0 = in_stack_ffffffffffffea48;
      local_12f8 = local_13a0;
      local_13e8 = (yyjson_mut_val *)
                   duckdb_yyjson::yyjson_val_mut_copy(local_1328,in_stack_ffffffffffffea48);
      local_fd8 = local_1328;
      local_fe0 = "projjson";
      in_stack_ffffffffffffea47 = local_1328 != (yyjson_mut_doc *)0x0;
      if ((bool)in_stack_ffffffffffffea47) {
        local_fe8 = strlen("projjson");
        local_c70 = local_fe0;
        local_c61 = 0;
        local_fe9 = 0;
        in_stack_ffffffffffffea45 = 0;
        in_stack_ffffffffffffea46 = 0;
        local_ec8 = local_fd8;
        local_ed0 = 1;
        local_ee0 = &local_fd8->alc;
        local_ee8 = &local_fd8->val_pool;
        local_fea = in_stack_ffffffffffffea46;
        local_c78 = local_fe8;
        if ((((long)(local_fd8->val_pool).end - (long)local_ee8->cur) / 0x18 == 0) &&
           (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(local_ee8,local_ee0,1),
           ((bVar3 ^ 0xff) & 1) != 0)) {
          local_ec0 = (yyjson_mut_val *)0x0;
        }
        else {
          local_ed8 = local_ee8->cur;
          local_ee8->cur = local_ee8->cur + local_ed0;
          local_ec0 = local_ed8;
        }
        local_ff8 = local_ec0;
        local_b68 = local_fd8;
        local_b70 = local_fe0;
        local_b78 = local_fe8;
        local_908 = local_fd8;
        local_910 = local_fe8;
        local_920 = &local_fd8->alc;
        local_928 = &local_fd8->str_pool;
        if ((local_fe8 < (ulong)((long)(local_fd8->str_pool).end - (long)local_928->cur)) ||
           (bVar3 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(local_928,local_920,local_fe8 + 1),
           ((bVar3 ^ 0xff) & 1) == 0)) {
          local_918 = local_928->cur;
          local_928->cur = local_918 + local_910 + 1;
          local_900 = local_918;
        }
        else {
          local_900 = (char *)0x0;
        }
        local_b80 = local_900;
        if (local_900 == (char *)0x0) {
          local_b60 = (char *)0x0;
        }
        else {
          memcpy(local_900,local_b70,local_b78);
          local_b80[local_b78] = '\0';
          local_b60 = local_b80;
        }
        local_1000 = local_b60;
        in_stack_ffffffffffffea44 = local_ff8 != (yyjson_mut_val *)0x0 && local_b60 != (char *)0x0;
        if (local_ff8 == (yyjson_mut_val *)0x0 || local_b60 == (char *)0x0) goto LAB_006eac38;
        local_ff8->tag = local_fe8 << 8 | (long)(int)(local_fea | 5);
        (local_ff8->uni).ptr = local_b60;
        local_fd0 = local_ff8;
      }
      else {
LAB_006eac38:
        local_fd0 = (yyjson_mut_val *)0x0;
      }
      local_13f0 = local_fd0;
      local_f38 = local_1360;
      local_f40 = local_fd0;
      local_f48 = local_13e8;
      local_d98 = local_1360;
      if (local_1360 == (yyjson_mut_val *)0x0) {
        in_stack_ffffffffffffea43 = false;
      }
      else {
        local_d90 = local_1360;
        local_d80 = local_1360;
        local_d81 = (byte)local_1360->tag;
        in_stack_ffffffffffffea43 = (local_d81 & 7) == 7;
      }
      in_stack_ffffffffffffea42 = false;
      if ((bool)in_stack_ffffffffffffea43 != false) {
        local_a0 = local_fd0;
        if (local_fd0 == (yyjson_mut_val *)0x0) {
          in_stack_ffffffffffffea41 = false;
        }
        else {
          local_98 = local_fd0;
          local_88 = local_fd0;
          local_89 = (byte)local_fd0->tag;
          in_stack_ffffffffffffea41 = (local_89 & 7) == 5;
        }
        in_stack_ffffffffffffea42 = false;
        if ((bool)in_stack_ffffffffffffea41 != false) {
          in_stack_ffffffffffffea42 = local_13e8 != (yyjson_mut_val *)0x0;
        }
      }
      if ((bool)in_stack_ffffffffffffea42 == false) {
        local_f29 = 0;
      }
      else {
        local_f28 = local_1360;
        local_af8 = local_1360->tag >> 8;
        local_ae0 = local_1360;
        local_ae8 = local_fd0;
        local_af0 = local_13e8;
        if (local_af8 == 0) {
          local_13e8->next = local_fd0;
        }
        else {
          local_b00 = *(long *)((local_1360->uni).u64 + 0x10);
          local_b08 = *(yyjson_mut_val **)(local_b00 + 0x10);
          *(yyjson_mut_val **)(local_b00 + 0x10) = local_fd0;
          local_13e8->next = local_b08;
        }
        local_fd0->next = local_13e8;
        (local_1360->uni).str = (char *)local_fd0;
        local_848 = local_af8 + 1;
        local_840 = local_1360;
        local_850 = local_848 * 0x100 | local_1360->tag & 0xff;
        local_1360->tag = local_850;
        local_f29 = 1;
      }
      local_12d0 = local_13a0;
      if (local_13a0 != (undefined8 *)0x0) {
        local_12f0 = local_13a0[1];
        local_12e8 = local_13a0[2];
        local_12e0 = (code *)local_13a0[3];
        local_12d8 = local_13a0[4];
        memset(local_13a0 + 1,0,0x20);
        if (local_12d0[7] != 0) {
          (*local_12e0)(local_12d8,local_12d0[7]);
        }
        (*local_12e0)(local_12d8,local_12d0);
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_false,_true>
                  *)in_stack_ffffffffffffea10);
  } while( true );
}

Assistant:

void GeoParquetFileMetadata::Write(duckdb_parquet::FileMetaData &file_meta_data) const {

	yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
	yyjson_mut_val *root = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, root);

	// Add the version
	yyjson_mut_obj_add_strncpy(doc, root, "version", version.c_str(), version.size());

	// Add the primary column
	yyjson_mut_obj_add_strncpy(doc, root, "primary_column", primary_geometry_column.c_str(),
	                           primary_geometry_column.size());

	// Add the columns
	const auto json_columns = yyjson_mut_obj_add_obj(doc, root, "columns");

	for (auto &column : geometry_columns) {
		const auto column_json = yyjson_mut_obj_add_obj(doc, json_columns, column.first.c_str());
		yyjson_mut_obj_add_str(doc, column_json, "encoding", "WKB");
		const auto geometry_types = yyjson_mut_obj_add_arr(doc, column_json, "geometry_types");
		for (auto &geometry_type : column.second.geometry_types) {
			const auto type_name = WKBGeometryTypes::ToString(geometry_type);
			yyjson_mut_arr_add_str(doc, geometry_types, type_name);
		}
		const auto bbox = yyjson_mut_obj_add_arr(doc, column_json, "bbox");
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.min_x);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.min_y);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.max_x);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.max_y);

		// If the CRS is present, add it
		if (!column.second.projjson.empty()) {
			const auto crs_doc = yyjson_read(column.second.projjson.c_str(), column.second.projjson.size(), 0);
			if (!crs_doc) {
				yyjson_mut_doc_free(doc);
				throw InvalidInputException("Failed to parse CRS JSON");
			}
			const auto crs_root = yyjson_doc_get_root(crs_doc);
			const auto crs_val = yyjson_val_mut_copy(doc, crs_root);
			const auto crs_key = yyjson_mut_strcpy(doc, "projjson");
			yyjson_mut_obj_add(column_json, crs_key, crs_val);
			yyjson_doc_free(crs_doc);
		}
	}

	yyjson_write_err err;
	size_t len;
	char *json = yyjson_mut_write_opts(doc, 0, nullptr, &len, &err);
	if (!json) {
		yyjson_mut_doc_free(doc);
		throw SerializationException("Failed to write JSON string: %s", err.msg);
	}

	// Create a string from the JSON
	duckdb_parquet::KeyValue kv;
	kv.__set_key("geo");
	kv.__set_value(string(json, len));

	// Free the JSON and the document
	free(json);
	yyjson_mut_doc_free(doc);

	file_meta_data.key_value_metadata.push_back(kv);
	file_meta_data.__isset.key_value_metadata = true;
}